

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void mp::
     WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::QuadTerms>
               (JSONW *jw,QuadTerms *qt)

{
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_RDI;
  ArrayRef<double> *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff08;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff10;
  QuadTerms *in_stack_ffffffffffffff18;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff38;
  string_view in_stack_ffffffffffffff40;
  
  QuadTerms::coefs(in_stack_ffffffffffffff18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_RDI,in_stack_fffffffffffffef8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x50ba9d);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x50baaa);
  QuadTerms::vars1(in_stack_ffffffffffffff18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_RDI,(ArrayRef<int> *)in_stack_fffffffffffffef8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x50bb03);
  ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x50bb0d);
  QuadTerms::vars2(in_stack_ffffffffffffff18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_RDI,(ArrayRef<int> *)in_stack_fffffffffffffef8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x50bb66);
  ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x50bb70);
  return;
}

Assistant:

void WriteJSON(JSONW jw, const QuadTerms& qt) {
  jw["coefs"] = qt.coefs();
  jw["vars1"] = qt.vars1();
  jw["vars2"] = qt.vars2();
}